

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
          (ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *this,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> begin,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> end,char *sep,
          int precedence)

{
  BasicWriter<char> *this_00;
  size_t sVar1;
  BasicStringRef<char> value;
  
  fmt::BasicWriter<char>::operator<<(*(BasicWriter<char> **)(this + 8),'(');
  if (begin.ptr_ != end.ptr_) {
    while( true ) {
      ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
                ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this,
                 (NumericExpr)((ExprBase *)begin.ptr_)->impl_,precedence);
      if ((ExprBase *)begin.ptr_ + 1 == (ExprBase *)end.ptr_) break;
      this_00 = *(BasicWriter<char> **)(this + 8);
      sVar1 = strlen(sep);
      value.size_ = sVar1;
      value.data_ = sep;
      fmt::BasicWriter<char>::operator<<(this_00,value);
      begin.ptr_ = &((ExprBase *)begin.ptr_)[1].impl_;
    }
  }
  fmt::BasicWriter<char>::operator<<(*(BasicWriter<char> **)(this + 8),')');
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteArgs(
    Iter begin, Iter end, const char *sep, int precedence) {
  writer_ << '(';
  if (begin != end) {
    Visit(*begin, precedence);
    for (++begin; begin != end; ++begin) {
      writer_ << sep;
      Visit(*begin, precedence);
    }
  }
  writer_ << ')';
}